

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpringConstraint::setEquilibriumPoint(btGeneric6DofSpringConstraint *this,int index)

{
  btScalar *pbVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  btGeneric6DofConstraint::calculateTransforms
            ((btGeneric6DofConstraint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (in_ESI < 3) {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x500));
    *(btScalar *)(in_RDI + 0x53c + (long)in_ESI * 4) = pbVar1[in_ESI];
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x4c0));
    *(btScalar *)(in_RDI + 0x53c + (long)in_ESI * 4) = pbVar1[in_ESI + -3];
  }
  return;
}

Assistant:

void btGeneric6DofSpringConstraint::setEquilibriumPoint(int index)
{
	btAssert((index >= 0) && (index < 6));
	calculateTransforms();
	if(index < 3)
	{
		m_equilibriumPoint[index] = m_calculatedLinearDiff[index];
	}
	else
	{
		m_equilibriumPoint[index] = m_calculatedAxisAngleDiff[index - 3];
	}
}